

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

size_t stumpless_read_buffer(stumpless_target *target,char *buffer,size_t max_length)

{
  long *plVar1;
  ulong local_40;
  size_t out_position;
  size_t read_position;
  buffer_target *buffer_target;
  size_t max_length_local;
  char *buffer_local;
  stumpless_target *target_local;
  
  local_40 = 0;
  if (target == (stumpless_target *)0x0) {
    raise_argument_empty("target was NULL");
    target_local = (stumpless_target *)0x0;
  }
  else if ((buffer == (char *)0x0) || (max_length == 0)) {
    raise_argument_empty("buffer was NULL");
    target_local = (stumpless_target *)0x0;
  }
  else {
    plVar1 = (long *)target->id;
    pthread_lock_mutex((pthread_mutex_t *)(plVar1 + 4));
    out_position = plVar1[2];
    for (; out_position != plVar1[3] && local_40 < max_length - 1; local_40 = local_40 + 1) {
      buffer[local_40] = *(char *)(*plVar1 + out_position);
      out_position = (out_position + 1) % (ulong)plVar1[1];
      if (buffer[local_40] == '\0') goto LAB_00113dd7;
    }
    buffer[local_40] = '\0';
LAB_00113dd7:
    plVar1[2] = out_position;
    pthread_unlock_mutex((pthread_mutex_t *)(plVar1 + 4));
    target_local = (stumpless_target *)(local_40 + 1);
  }
  return (size_t)target_local;
}

Assistant:

size_t
stumpless_read_buffer( struct stumpless_target *target,
                       char *buffer,
                       size_t max_length ) {
  struct buffer_target *buffer_target;
  size_t read_position;
  size_t out_position = 0;

  if( !target ) {
    raise_argument_empty( L10N_NULL_ARG_ERROR_MESSAGE( "target" ) );
    return 0;
  }

  if( !buffer || max_length == 0 ) {
    raise_argument_empty( L10N_NULL_ARG_ERROR_MESSAGE( "buffer" ) );
    return 0;
  }

  buffer_target = ( struct buffer_target * ) target->id;

  config_lock_mutex( &buffer_target->buffer_mutex );

  read_position = buffer_target->read_position;
  while( read_position != buffer_target->write_position &&
         out_position < max_length - 1 ) {
    buffer[out_position] = buffer_target->buffer[read_position];
    read_position = ( read_position + 1 ) % buffer_target->size;

    if( buffer[out_position] == '\0' ) {
      goto cleanup_and_return;
    }

    out_position++;
  }

  buffer[out_position] = '\0';

cleanup_and_return:
  buffer_target->read_position = read_position;
  config_unlock_mutex( &buffer_target->buffer_mutex );
  return out_position + 1;
}